

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-pump.c
# Opt level: O2

int run_helper_pipe_pump_server(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  type = 1;
  loop = uv_default_loop();
  server = (uv_stream_t *)&pipeServer;
  iVar1 = uv_pipe_init(loop,&pipeServer,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_bind(&pipeServer,"/tmp/uv-test-sock");
    if (iVar1 == 0) {
      iVar1 = uv_listen((uv_stream_t *)&pipeServer,1000,connection_cb);
      if (iVar1 == 0) {
        notify_parent_process();
        uv_run(loop,UV_RUN_DEFAULT);
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar4 = "0 == uv_loop_close(uv_default_loop())";
        uVar3 = 0x1a2;
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x19d;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x19b;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x199;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-pump.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

HELPER_IMPL(pipe_pump_server) {
  int r;
  type = PIPE;

  loop = uv_default_loop();

  /* Server */
  server = (uv_stream_t*)&pipeServer;
  r = uv_pipe_init(loop, &pipeServer, 0);
  ASSERT(r == 0);
  r = uv_pipe_bind(&pipeServer, TEST_PIPENAME);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&pipeServer, MAX_WRITE_HANDLES, connection_cb);
  ASSERT(r == 0);

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}